

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_> * __thiscall
TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>::operator=
          (TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_> *this,
          TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_> *o)

{
  hash_t size;
  TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_> *o_local;
  TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_> *this_local;
  
  this->NumUsed = 0;
  ClearNodeVector(this);
  size = CountUsed(o);
  SetNodeVector(this,size);
  CopyNodes(this,o->Nodes,o->Size);
  return this;
}

Assistant:

TMap &operator= (const TMap &o)
	{
		NumUsed = 0;
		ClearNodeVector();
		SetNodeVector(o.CountUsed());
		CopyNodes(o.Nodes, o.Size);
		return *this;
	}